

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall
jsonnet::internal::Assert::Assert
          (Assert *this,LocationRange *lr,Fodder *open_fodder,AST *cond,Fodder *colon_fodder,
          AST *message,Fodder *semicolon_fodder,AST *rest)

{
  AST::AST(&this->super_AST,lr,AST_ASSERT,open_fodder);
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__Assert_0023bae8;
  this->cond = cond;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->colonFodder,colon_fodder);
  this->message = message;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->semicolonFodder,semicolon_fodder);
  this->rest = rest;
  return;
}

Assistant:

Assert(const LocationRange &lr, const Fodder &open_fodder, AST *cond,
           const Fodder &colon_fodder, AST *message, const Fodder &semicolon_fodder, AST *rest)
        : AST(lr, AST_ASSERT, open_fodder),
          cond(cond),
          colonFodder(colon_fodder),
          message(message),
          semicolonFodder(semicolon_fodder),
          rest(rest)
    {
    }